

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void print(AmsAddr *addr,ostream *out)

{
  ostream *poVar1;
  char local_1f [7];
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"AmsAddr: ",9);
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = (ostream *)std::ostream::operator<<(out,(uint)(byte)addr->netId);
  local_1f[0] = '.';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1f,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)(byte)addr->field_0x1);
  local_1f[1] = 0x2e;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1f + 1,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)(byte)addr->field_0x2);
  local_1f[2] = 0x2e;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1f + 2,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)(byte)addr->field_0x3);
  local_1f[3] = 0x2e;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1f + 3,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)(byte)addr->field_0x4);
  local_1f[4] = 0x2e;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1f + 4,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)(byte)addr->field_0x5);
  local_1f[5] = 0x3a;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1f + 5,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_1f[6] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1f + 6,1);
  return;
}

Assistant:

void print(const AmsAddr& addr, std::ostream& out)
{
    out << "AmsAddr: " << std::dec <<
        (int)addr.netId.b[0] << '.' << (int)addr.netId.b[1] << '.' << (int)addr.netId.b[2] << '.' <<
        (int)addr.netId.b[3] << '.' << (int)addr.netId.b[4] << '.' << (int)addr.netId.b[5] << ':' <<
        addr.port << '\n';
}